

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O1

Vec_Int_t * Abc_NtkDelayTraceSlackStart(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Ptr_t *pVVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  
  iVar1 = pNtk->vObjs->nSize;
  iVar4 = Abc_NtkGetTotalFanins(pNtk);
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar8 = 0x10;
  if (0xe < (iVar4 + iVar1) - 1U) {
    iVar8 = iVar4 + iVar1;
  }
  pVVar5->nSize = 0;
  pVVar5->nCap = iVar8;
  if (iVar8 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar8 << 2);
  }
  pVVar5->pArray = piVar6;
  uVar10 = pNtk->vObjs->nSize;
  if (iVar8 < (int)uVar10) {
    if (piVar6 == (int *)0x0) {
      piVar6 = (int *)malloc((long)(int)uVar10 << 2);
    }
    else {
      piVar6 = (int *)realloc(piVar6,(long)(int)uVar10 << 2);
    }
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
LAB_002b4307:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = uVar10;
  }
  if (0 < (int)uVar10) {
    memset(pVVar5->pArray,0xff,(ulong)uVar10 * 4);
  }
  pVVar5->nSize = uVar10;
  pVVar7 = pNtk->vObjs;
  if (0 < pVVar7->nSize) {
    lVar12 = 0;
    do {
      pvVar2 = pVVar7->pArray[lVar12];
      if ((pvVar2 != (void *)0x0) && ((*(uint *)((long)pvVar2 + 0x14) & 0xf) == 7)) {
        if (pVVar5->nSize <= lVar12) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pVVar5->pArray[lVar12] = pVVar5->nSize;
        if (0 < *(int *)((long)pvVar2 + 0x1c)) {
          iVar1 = pVVar5->nSize;
          uVar10 = pVVar5->nCap;
          lVar9 = 0;
          do {
            uVar3 = uVar10;
            if (iVar1 + (int)lVar9 == uVar10) {
              if ((int)uVar10 < 0x10) {
                if (pVVar5->pArray == (int *)0x0) {
                  piVar6 = (int *)malloc(0x40);
                }
                else {
                  piVar6 = (int *)realloc(pVVar5->pArray,0x40);
                }
                pVVar5->pArray = piVar6;
                uVar11 = 0x10;
              }
              else {
                uVar11 = uVar10 * 2;
                if ((int)uVar11 <= (int)uVar10) goto LAB_002b42b0;
                if (pVVar5->pArray == (int *)0x0) {
                  piVar6 = (int *)malloc((ulong)uVar11 << 2);
                }
                else {
                  piVar6 = (int *)realloc(pVVar5->pArray,(ulong)uVar11 << 2);
                }
                pVVar5->pArray = piVar6;
              }
              uVar3 = uVar11;
              if (piVar6 == (int *)0x0) {
                pVVar5->nSize = iVar1 + (int)lVar9;
                pVVar5->nCap = uVar10;
                goto LAB_002b4307;
              }
            }
LAB_002b42b0:
            uVar10 = uVar3;
            pVVar5->pArray[iVar1 + lVar9] = -1;
            lVar9 = lVar9 + 1;
          } while ((int)lVar9 < *(int *)((long)pvVar2 + 0x1c));
          pVVar5->nSize = (int)lVar9 + iVar1;
          pVVar5->nCap = uVar10;
        }
      }
      lVar12 = lVar12 + 1;
      pVVar7 = pNtk->vObjs;
    } while (lVar12 < pVVar7->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkDelayTraceSlackStart( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vSlacks;
    Abc_Obj_t * pObj;
    int i, k;
    vSlacks = Vec_IntAlloc( Abc_NtkObjNumMax(pNtk) + Abc_NtkGetTotalFanins(pNtk) );
    Vec_IntFill( vSlacks, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        Vec_IntWriteEntry( vSlacks, i, Vec_IntSize(vSlacks) );
        for ( k = 0; k < Abc_ObjFaninNum(pObj); k++ )
            Vec_IntPush( vSlacks, -1 );
    }
//    assert( Abc_MaxInt(16, Vec_IntSize(vSlacks)) == Vec_IntCap(vSlacks) );
    return vSlacks;
}